

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_FullNode16_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_FullNode16_Test
          (ARTCorrectnessTest_FullNode16_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_FullNode16_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTCorrectnessTest_FullNode16_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, FullNode16) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(0, 16);

  verifier.check_absent_keys({16});
  verifier.check_present_values();

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({16, 0, 1, 0, 0});
  verifier.assert_growing_inodes({1, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}